

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall
CVmObject::getp_get_prop_list
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_5,
          vm_obj_id_t *param_6)

{
  int iVar1;
  vm_val_t *this_00;
  undefined8 in_RDX;
  vm_obj_id_t in_ESI;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc
       == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_prop_list::desc,0);
    __cxa_guard_release(&getp_get_prop_list(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                         ::desc);
  }
  iVar1 = get_prop_check_argc(in_stack_ffffffffffffffb8,in_RDI,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,in_ESI,in_RDX);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObject::getp_get_prop_list(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc,
                                  vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* build my property list */
    build_prop_list(vmg_ self, retval);

    /* discard the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}